

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

bool __thiscall DConversationMenu::Responder(DConversationMenu *this,event_t *ev)

{
  int iVar1;
  int local_2c;
  event_t *ev_local;
  DConversationMenu *this_local;
  
  if (demoplayback) {
    this_local._7_1_ = false;
  }
  else if ((((ev->type == '\x04') && (ev->subtype == '\x04')) && (0x2f < ev->data1)) &&
          (ev->data1 < 0x3a)) {
    if (ev->data1 == 0x30) {
      local_2c = 9;
    }
    else {
      local_2c = ev->data1 + -0x31;
    }
    mSelection = local_2c;
    iVar1 = (*(this->super_DMenu).super_DObject._vptr_DObject[8])(this,6,0);
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
  }
  else {
    this_local._7_1_ = DMenu::Responder(&this->super_DMenu,ev);
  }
  return this_local._7_1_;
}

Assistant:

bool Responder(event_t *ev)
	{
		if (demoplayback)
		{ // No interaction during demo playback
			return false;
		}
		if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_Char && ev->data1 >= '0' && ev->data1 <= '9')
		{ // Activate an item of type numberedmore (dialogue only)
			mSelection = ev->data1 == '0' ? 9 : ev->data1 - '1';
			return MenuEvent(MKEY_Enter, false);
		}
		return Super::Responder(ev);
	}